

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> __thiscall
wabt::MakeUnique<wabt::TableCopyExpr,wabt::Var,wabt::Var>(wabt *this,Var *args,Var *args_1)

{
  TableCopyExpr *this_00;
  Location LStack_48;
  
  this_00 = (TableCopyExpr *)operator_new(0xd0);
  LStack_48.field_1.field_0.line = 0;
  LStack_48.field_1._4_8_ = 0;
  LStack_48.filename.data_ = (char *)0x0;
  LStack_48.filename.size_._0_4_ = 0;
  LStack_48.filename.size_._4_4_ = 0;
  TableCopyExpr::TableCopyExpr(this_00,args,args_1,&LStack_48);
  *(TableCopyExpr **)this = this_00;
  return (__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
         )(__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}